

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,call_expression *e)

{
  char *pcVar1;
  expression *e_00;
  expression_list *this_00;
  size_type sVar2;
  const_reference this_01;
  type e_01;
  ulong local_28;
  size_t i;
  expression_list *args;
  call_expression *e_local;
  print_visitor *this_local;
  
  e_00 = call_expression::member(e);
  accept<mjs::print_visitor>(e_00,this);
  std::operator<<(this->os_,'(');
  this_00 = call_expression::arguments(e);
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
            ::size(this_00);
    if (sVar2 <= local_28) break;
    pcVar1 = "\t";
    if (local_28 != 0) {
      pcVar1 = "], ";
    }
    std::operator<<(this->os_,pcVar1 + 1);
    this_01 = std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::operator[](this_00,local_28);
    e_01 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                     (this_01);
    accept<mjs::print_visitor>(e_01,this);
    local_28 = local_28 + 1;
  }
  std::operator<<(this->os_,')');
  return;
}

Assistant:

void operator()(const call_expression& e) {
        accept(e.member(), *this);
        os_ << '(';
        const auto& args = e.arguments();
        for (size_t i = 0; i < args.size(); ++i) {
            os_ << (i ? ", " : "");
            accept(*args[i], *this);
        }
        os_ << ')';
    }